

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaAigerExt.c
# Opt level: O2

Vec_Str_t * Gia_AigerWriteMapping(Gia_Man_t *p)

{
  uchar *pArray;
  Vec_Str_t *pVVar1;
  int nMapSize;
  int local_c;
  
  pArray = Gia_AigerWriteMappingInt(p,&local_c);
  pVVar1 = Vec_StrAllocArray((char *)pArray,local_c);
  return pVVar1;
}

Assistant:

Vec_Str_t * Gia_AigerWriteMapping( Gia_Man_t * p )
{
    int nMapSize;
    unsigned char * pBuffer = Gia_AigerWriteMappingInt( p, &nMapSize );
    return Vec_StrAllocArray( (char *)pBuffer, nMapSize );
}